

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimeparser.cpp
# Opt level: O2

void __thiscall QtMWidgets::DateTimeParser::DateTimeParser(DateTimeParser *this,Type t)

{
  QLatin1String latin1;
  QArrayDataPointer<char16_t> local_30;
  
  this->_vptr_DateTimeParser = (_func_int **)&PTR__DateTimeParser_001b0bb0;
  (this->sections).d.d = (Data *)0x0;
  (this->sections).d.ptr = (Section *)0x0;
  (this->sections).d.size = 0;
  this->type = t;
  (this->format).d.d = (Data *)0x0;
  (this->format).d.ptr = (char16_t *)0x0;
  (this->format).d.size = 0;
  latin1.m_data = "dddd MMMM yyyy hh mm";
  latin1.m_size = 0x14;
  QString::QString((QString *)&local_30,latin1);
  parseFormat(this,(QString *)&local_30);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  return;
}

Assistant:

DateTimeParser::DateTimeParser( QMetaType::Type t )
	:	type( t )
{
	parseFormat( QLatin1String( "dddd MMMM yyyy hh mm" ) );
}